

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XPathMatcher::startElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,
          ValidationContext *validationContext)

{
  ulong uVar1;
  ulong uVar2;
  ulong getAt;
  XercesNodeTest *nodeTest;
  bool bVar3;
  int iVar4;
  int iVar5;
  ValueStackOf<unsigned_long> *pVVar6;
  XercesLocationPath *pXVar7;
  XercesStep *pXVar8;
  XMLAttr *pXVar9;
  SchemaAttDef *pSVar10;
  undefined4 extraout_var;
  XMLCh *pXVar11;
  undefined4 extraout_var_01;
  _func_int **pp_Var12;
  byte bVar13;
  ulong uVar14;
  XMLSize_t XVar15;
  DatatypeValidator *pDVar16;
  XMLSize_t XVar17;
  XPathMatcher *pXVar18;
  XMLSize_t XVar19;
  XMLSize_t getAt_00;
  QName elemQName;
  ArrayJanitor<char16_t> janPrefix;
  undefined1 local_b8 [32];
  MemoryManager *local_98;
  RefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_> *local_90;
  RefVectorOf<xercesc_4_0::XercesLocationPath> *pRStack_88;
  XMLCh *local_70;
  DatatypeValidator *local_68;
  SchemaElementDecl *local_60;
  XMLCh *local_58;
  XercesNodeTest *local_50;
  XPathMatcher *local_48;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  
  if (this->fLocationPathSize != 0) {
    getAt_00 = 0;
    local_60 = (SchemaElementDecl *)elemDecl;
    local_58 = elemPrefix;
    local_48 = (XPathMatcher *)attrList;
    do {
      uVar1 = this->fCurrentStep[getAt_00];
      pVVar6 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                         (&this->fStepIndexes->
                           super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,getAt_00
                         );
      ValueVectorOf<unsigned_long>::ensureExtraCapacity(&pVVar6->fVector,1);
      XVar19 = (pVVar6->fVector).fCurCount;
      (pVVar6->fVector).fCurCount = XVar19 + 1;
      (pVVar6->fVector).fElemList[XVar19] = uVar1;
      bVar13 = this->fMatched[getAt_00] & 5;
      if ((bVar13 == 1) || (this->fNoMatchDepth[getAt_00] != 0)) {
LAB_0031b18c:
        this->fNoMatchDepth[getAt_00] = this->fNoMatchDepth[getAt_00] + 1;
      }
      else {
        if (bVar13 == 5) {
          this->fMatched[getAt_00] = '\r';
        }
        pXVar7 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                           (&this->fLocationPaths->
                             super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,getAt_00);
        if (pXVar7->fSteps == (RefVectorOf<xercesc_4_0::XercesStep> *)0x0) {
          XVar19 = 0;
        }
        else {
          XVar19 = (pXVar7->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>).fCurCount;
        }
        XVar17 = this->fCurrentStep[getAt_00];
        while ((XVar17 < XVar19 &&
               (pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                   (&pXVar7->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                    XVar17), pXVar8->fAxisType == 3))) {
          XVar17 = this->fCurrentStep[getAt_00] + 1;
          this->fCurrentStep[getAt_00] = XVar17;
        }
        uVar2 = this->fCurrentStep[getAt_00];
        if (uVar2 == XVar19) {
LAB_0031b208:
          this->fMatched[getAt_00] = '\x01';
        }
        else {
          XVar17 = this->fCurrentStep[getAt_00];
          while ((XVar17 < XVar19 &&
                 (pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                     (&pXVar7->fSteps->
                                       super_BaseRefVectorOf<xercesc_4_0::XercesStep>,XVar17),
                 pXVar8->fAxisType == 4))) {
            XVar17 = this->fCurrentStep[getAt_00] + 1;
            this->fCurrentStep[getAt_00] = XVar17;
          }
          getAt = this->fCurrentStep[getAt_00];
          if (getAt == XVar19) goto LAB_0031b18c;
          if ((getAt == uVar1 || uVar2 < getAt) &&
             (pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                 (&pXVar7->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                  getAt), pXVar8->fAxisType == 1)) {
            pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                               (&pXVar7->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                this->fCurrentStep[getAt_00]);
            nodeTest = pXVar8->fNodeTest;
            pXVar18 = (XPathMatcher *)local_b8;
            QName::QName((QName *)pXVar18,local_58,
                         ((local_60->super_XMLElementDecl).fElementName)->fLocalPart,urlId,
                         this->fMemoryManager);
            bVar3 = matches(pXVar18,nodeTest,(QName *)local_b8);
            uVar1 = this->fCurrentStep[getAt_00];
            if (bVar3) {
              uVar14 = uVar1 + 1;
LAB_0031b2ee:
              this->fCurrentStep[getAt_00] = uVar14;
            }
            else {
              uVar14 = uVar2;
              if (uVar2 < uVar1) goto LAB_0031b2ee;
              this->fNoMatchDepth[getAt_00] = this->fNoMatchDepth[getAt_00] + 1;
            }
            QName::~QName((QName *)local_b8);
            if (bVar3) goto LAB_0031b30f;
          }
          else {
LAB_0031b30f:
            uVar1 = this->fCurrentStep[getAt_00];
            if (uVar1 == XVar19) {
              if (getAt <= uVar2) goto LAB_0031b208;
              this->fCurrentStep[getAt_00] = uVar2;
              this->fMatched[getAt_00] = '\x05';
            }
            else if ((uVar1 < XVar19) &&
                    (pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                        (&pXVar7->fSteps->
                                          super_BaseRefVectorOf<xercesc_4_0::XercesStep>,uVar1),
                    pXVar8->fAxisType == 2)) {
              if (attrCount != 0) {
                pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                   (&pXVar7->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                    this->fCurrentStep[getAt_00]);
                local_50 = pXVar8->fNodeTest;
                XVar17 = 0;
                do {
                  while( true ) {
                    pXVar18 = local_48;
                    pXVar9 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                       ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)local_48,XVar17);
                    bVar3 = matches(pXVar18,local_50,pXVar9->fAttName);
                    if (!bVar3) break;
                    XVar15 = this->fCurrentStep[getAt_00] + 1;
                    this->fCurrentStep[getAt_00] = XVar15;
                    if (XVar15 == XVar19) {
                      this->fMatched[getAt_00] = '\x03';
                      pSVar10 = SchemaElementDecl::getAttDef
                                          (local_60,pXVar9->fAttName->fLocalPart,
                                           pXVar9->fAttName->fURIId);
                      if (pSVar10 == (SchemaAttDef *)0x0) {
                        pDVar16 = (DatatypeValidator *)0x0;
                      }
                      else {
                        pDVar16 = pSVar10->fDatatypeValidator;
                      }
                      pXVar11 = pXVar9->fValue;
                      if ((pDVar16 == (DatatypeValidator *)0x0) || (pDVar16->fType != QName)) {
                        pp_Var12 = this->_vptr_XPathMatcher;
                      }
                      else {
                        local_68 = pDVar16;
                        iVar4 = XMLString::indexOf(pXVar11,L':');
                        if (iVar4 != -1) {
                          local_98 = this->fMemoryManager;
                          local_b8._0_8_ = (_func_int **)0x0;
                          local_b8._8_8_ = (_func_int **)0x3ff;
                          local_b8._16_8_ = (uchar *)0x0;
                          local_b8[0x18] = false;
                          local_90 = (RefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_> *)0x0;
                          pRStack_88 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
                          local_70 = pXVar11;
                          iVar5 = (*local_98->_vptr_MemoryManager[3])(local_98,0x800);
                          pRStack_88 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)
                                       CONCAT44(extraout_var,iVar5);
                          *(undefined2 *)
                           &(pRStack_88->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).
                            _vptr_BaseRefVectorOf = 0;
                          if (local_b8._0_8_ == local_b8._8_8_) {
                            XMLBuffer::ensureCapacity((XMLBuffer *)local_b8,1);
                          }
                          pp_Var12 = (_func_int **)(local_b8._0_8_ + 1);
                          *(undefined2 *)
                           ((long)&(pRStack_88->
                                   super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).
                                   _vptr_BaseRefVectorOf + local_b8._0_8_ * 2) = 0x7b;
                          XVar15 = (XMLSize_t)iVar4;
                          local_b8._0_8_ = pp_Var12;
                          if (validationContext != (ValidationContext *)0x0) {
                            iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                              (this->fMemoryManager,XVar15 * 2 + 2);
                            pXVar11 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
                            ArrayJanitor<char16_t>::ArrayJanitor
                                      (&local_40,pXVar11,this->fMemoryManager);
                            XMLString::subString(pXVar11,local_70,0,XVar15,this->fMemoryManager);
                            iVar4 = (*validationContext->_vptr_ValidationContext[0xf])
                                              (validationContext,pXVar11);
                            XMLBuffer::append((XMLBuffer *)local_b8,
                                              (XMLCh *)CONCAT44(extraout_var_01,iVar4));
                            ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
                          }
                          if (local_b8._0_8_ == local_b8._8_8_) {
                            XMLBuffer::ensureCapacity((XMLBuffer *)local_b8,1);
                          }
                          *(undefined2 *)
                           ((long)&(pRStack_88->
                                   super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).
                                   _vptr_BaseRefVectorOf + local_b8._0_8_ * 2) = 0x7d;
                          local_b8._0_8_ = (_func_int **)(local_b8._0_8_ + 1);
                          XMLBuffer::append((XMLBuffer *)local_b8,local_70 + XVar15 + 1);
                          *(undefined2 *)
                           ((long)&(pRStack_88->
                                   super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).
                                   _vptr_BaseRefVectorOf + local_b8._0_8_ * 2) = 0;
                          (*this->_vptr_XPathMatcher[6])(this,pRStack_88,local_68,0);
                          (*local_98->_vptr_MemoryManager[4])(local_98,pRStack_88);
                          goto LAB_0031b5be;
                        }
                        pp_Var12 = this->_vptr_XPathMatcher;
                        pDVar16 = local_68;
                      }
                      (*pp_Var12[6])(this,pXVar11,pDVar16,0);
                    }
LAB_0031b5be:
                    XVar17 = XVar17 + 1;
                    if (bVar3 || attrCount <= XVar17) goto LAB_0031b5e5;
                  }
                  XVar17 = XVar17 + 1;
                } while (XVar17 < attrCount);
              }
LAB_0031b5e5:
              if ((this->fMatched[getAt_00] & 1) == 0) {
                if (this->fCurrentStep[getAt_00] <= uVar2) goto LAB_0031b18c;
                this->fCurrentStep[getAt_00] = uVar2;
              }
            }
          }
        }
      }
      getAt_00 = getAt_00 + 1;
    } while (getAt_00 < this->fLocationPathSize);
  }
  return;
}

Assistant:

void XPathMatcher::startElement(const XMLElementDecl& elemDecl,
                                const unsigned int urlId,
                                const XMLCh* const elemPrefix,
								const RefVectorOf<XMLAttr>& attrList,
                                const XMLSize_t attrCount,
                                ValidationContext* validationContext /*=0*/) {

    for (XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // push context
        XMLSize_t startStep = fCurrentStep[i];
        fStepIndexes->elementAt(i)->push(startStep);

        // try next xpath, if not matching
        if ((fMatched[i] & XP_MATCHED_D) == XP_MATCHED || fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]++;
            continue;
        }

        if((fMatched[i] & XP_MATCHED_D) == XP_MATCHED_D) {
            fMatched[i] = XP_MATCHED_DP;
        }

        // consume self::node() steps
        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_SELF) {
            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            fMatched[i] = XP_MATCHED;
            continue;
        }

        // now if the current step is a descendant step, we let the next
        // step do its thing; if it fails, we reset ourselves
        // to look at this step for next time we're called.
        // so first consume all descendants:
        XMLSize_t descendantStep = fCurrentStep[i];

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_DESCENDANT) {
            fCurrentStep[i]++;
        }

        bool sawDescendant = fCurrentStep[i] > descendantStep;
        if (fCurrentStep[i] == stepSize) {

            fNoMatchDepth[i]++;
            continue;
        }

        // match child::... step, if haven't consumed any self::node()
        if ((fCurrentStep[i] == startStep || fCurrentStep[i] > descendantStep) &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_CHILD) {

            XercesStep* step = locPath->getStep(fCurrentStep[i]);
            XercesNodeTest* nodeTest = step->getNodeTest();

            QName elemQName(elemPrefix, elemDecl.getElementName()->getLocalPart(), urlId, fMemoryManager);
            if (!matches(nodeTest, &elemQName)) {

                if(fCurrentStep[i] > descendantStep) {
                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
                continue;
            }

            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            if (sawDescendant) {

                fCurrentStep[i] = descendantStep;
                fMatched[i] = XP_MATCHED_D;
            }
            else {
                fMatched[i] = XP_MATCHED;
            }

            continue;
        }

        // match attribute::... step
        if (fCurrentStep[i] < stepSize &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {

            if (attrCount) {

                XercesNodeTest* nodeTest = locPath->getStep(fCurrentStep[i])->getNodeTest();

                for (XMLSize_t attrIndex = 0; attrIndex < attrCount; attrIndex++) {

                    const XMLAttr* curDef = attrList.elementAt(attrIndex);

                    if (matches(nodeTest, curDef->getAttName())) {

                        fCurrentStep[i]++;

                        if (fCurrentStep[i] == stepSize) {

                            fMatched[i] = XP_MATCHED_A;

                            SchemaAttDef* attDef = ((SchemaElementDecl&) elemDecl).getAttDef(curDef->getName(), curDef->getURIId());
                            DatatypeValidator* dv = (attDef) ? attDef->getDatatypeValidator() : 0;
                            const XMLCh* value = curDef->getValue();
                            // store QName using their Clark name
                            if(dv && dv->getType()==DatatypeValidator::QName)
                            {
                                int index=XMLString::indexOf(value, chColon);
                                if(index==-1)
                                    matched(value, dv, false);
                                else
                                {
                                    XMLBuffer buff(1023, fMemoryManager);
                                    buff.append(chOpenCurly);
                                    if(validationContext)
                                    {
                                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                                        XMLString::subString(prefix, value, 0, (XMLSize_t)index, fMemoryManager);
                                        buff.append(validationContext->getURIForPrefix(prefix));
                                    }
                                    buff.append(chCloseCurly);
                                    buff.append(value+index+1);
                                    matched(buff.getRawBuffer(), dv, false);
                                }
                            }
                            else
                                matched(value, dv, false);
                        }
                        break;
                    }
                }
            }

            if ((fMatched[i] & XP_MATCHED) != XP_MATCHED) {

                if(fCurrentStep[i] > descendantStep) {

                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
            }
        }
    }
}